

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_device.c
# Opt level: O0

int amqp_device_send_event_async
              (AMQP_DEVICE_HANDLE handle,IOTHUB_MESSAGE_LIST *message,
              ON_DEVICE_D2C_EVENT_SEND_COMPLETE on_device_d2c_event_send_complete_callback,
              void *context)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  undefined8 *__s;
  LOGGER_LOG l_2;
  AMQP_DEVICE_INSTANCE_conflict *instance;
  LOGGER_LOG l_1;
  DEVICE_SEND_EVENT_TASK *send_task;
  LOGGER_LOG l;
  int result;
  void *context_local;
  ON_DEVICE_D2C_EVENT_SEND_COMPLETE on_device_d2c_event_send_complete_callback_local;
  IOTHUB_MESSAGE_LIST *message_local;
  AMQP_DEVICE_HANDLE handle_local;
  
  if ((handle == (AMQP_DEVICE_HANDLE)0x0) || (message == (IOTHUB_MESSAGE_LIST *)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                ,"amqp_device_send_event_async",0x493,1,
                "Failed sending event (either handle (%p) or message (%p) are NULL)",handle,message)
      ;
    }
    l._4_4_ = 0x494;
  }
  else {
    __s = (undefined8 *)malloc(0x10);
    if (__s == (undefined8 *)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                  ,"amqp_device_send_event_async",0x49c,1,
                  "Failed sending event (failed creating task to send event)");
      }
      l._4_4_ = 0x49d;
    }
    else {
      memset(__s,0,0x10);
      *__s = on_device_d2c_event_send_complete_callback;
      __s[1] = context;
      iVar1 = telemetry_messenger_send_async
                        (handle->messenger_handle,message,on_event_send_complete_messenger_callback,
                         __s);
      if (iVar1 == 0) {
        l._4_4_ = 0;
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                    ,"amqp_device_send_event_async",0x4a9,1,
                    "Failed sending event (telemetry_messenger_send_async failed)");
        }
        free(__s);
        l._4_4_ = 0x4ab;
      }
    }
  }
  return l._4_4_;
}

Assistant:

int amqp_device_send_event_async(AMQP_DEVICE_HANDLE handle, IOTHUB_MESSAGE_LIST* message, ON_DEVICE_D2C_EVENT_SEND_COMPLETE on_device_d2c_event_send_complete_callback, void* context)
{
    int result;

    if (handle == NULL || message == NULL)
    {
        LogError("Failed sending event (either handle (%p) or message (%p) are NULL)", handle, message);
        result = MU_FAILURE;
    }
    else
    {
        DEVICE_SEND_EVENT_TASK* send_task;

        if ((send_task = (DEVICE_SEND_EVENT_TASK*)malloc(sizeof(DEVICE_SEND_EVENT_TASK))) == NULL)
        {
            LogError("Failed sending event (failed creating task to send event)");
            result = MU_FAILURE;
        }
        else
        {
            AMQP_DEVICE_INSTANCE* instance = (AMQP_DEVICE_INSTANCE*)handle;

            memset(send_task, 0, sizeof(DEVICE_SEND_EVENT_TASK));
            send_task->on_event_send_complete_callback = on_device_d2c_event_send_complete_callback;
            send_task->on_event_send_complete_context = context;

            if (telemetry_messenger_send_async(instance->messenger_handle, message, on_event_send_complete_messenger_callback, (void*)send_task) != RESULT_OK)
            {
                LogError("Failed sending event (telemetry_messenger_send_async failed)");
                free(send_task);
                result = MU_FAILURE;
            }
            else
            {
                result = RESULT_OK;
            }
        }
    }

    return result;
}